

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

void duckdb_je_extent_record
               (tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,ecache_t *ecache,edata_t *edata)

{
  locked_u64_t *plVar1;
  atomic_zu_t *paVar2;
  ulong uVar3;
  undefined8 in_RAX;
  ssize_t sVar4;
  _Bool coalesced;
  undefined8 uStack_38;
  _Bool coalesced_unused;
  
  uStack_38 = in_RAX;
  malloc_mutex_lock(tsdn,&ecache->mtx);
  if ((edata->e_bits & 0x10000) == 0) {
    if (ecache->delay_coalesce == false) {
      edata = extent_try_coalesce_impl(tsdn,pac,ehooks,ecache,edata,&coalesced_unused);
    }
    else if (0x3fff < (edata->field_2).e_size_esn) {
      do {
        edata = extent_try_coalesce_impl(tsdn,pac,ehooks,ecache,edata,&coalesced);
      } while (coalesced != false);
      if (((pac->duckdb_je_oversize_threshold).repr <=
           ((edata->field_2).e_size_esn & 0xfffffffffffff000)) &&
         ((duckdb_je_background_thread_enabled_state.repr & 1U) == 0)) {
        sVar4 = duckdb_je_pac_decay_ms_get(pac,extent_state_dirty);
        if (sVar4 != -1) {
          sVar4 = duckdb_je_pac_decay_ms_get(pac,extent_state_muzzy);
          if (sVar4 != -1) {
            (ecache->mtx).field_0.field_0.locked.repr = false;
            pthread_mutex_unlock((pthread_mutex_t *)((long)&(ecache->mtx).field_0 + 0x48));
            uVar3 = (edata->field_2).e_size_esn;
            duckdb_je_extent_dalloc_wrapper(tsdn,pac,ehooks,edata);
            LOCK();
            plVar1 = &(pac->stats->decay_dirty).nmadvise;
            (plVar1->val).repr = (plVar1->val).repr + 1;
            UNLOCK();
            LOCK();
            plVar1 = &(pac->stats->decay_dirty).purged;
            (plVar1->val).repr = (plVar1->val).repr + (uVar3 >> 0xc);
            UNLOCK();
            LOCK();
            paVar2 = &pac->stats->pac_mapped;
            paVar2->repr = paVar2->repr - (uVar3 & 0xfffffffffffff000);
            UNLOCK();
            return;
          }
        }
      }
    }
  }
  extent_deactivate_locked_impl(tsdn,pac,ecache,edata);
  (ecache->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(ecache->mtx).field_0 + 0x48));
  return;
}

Assistant:

void
extent_record(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks, ecache_t *ecache,
    edata_t *edata) {
	assert((ecache->state != extent_state_dirty &&
	    ecache->state != extent_state_muzzy) ||
	    !edata_zeroed_get(edata));

	malloc_mutex_lock(tsdn, &ecache->mtx);

	emap_assert_mapped(tsdn, pac->emap, edata);

	if (edata_guarded_get(edata)) {
		goto label_skip_coalesce;
	}
	if (!ecache->delay_coalesce) {
		bool coalesced_unused;
		edata = extent_try_coalesce(tsdn, pac, ehooks, ecache, edata,
		    &coalesced_unused);
	} else if (edata_size_get(edata) >= SC_LARGE_MINCLASS) {
		assert(ecache == &pac->ecache_dirty);
		/* Always coalesce large extents eagerly. */
		bool coalesced;
		do {
			assert(edata_state_get(edata) == extent_state_active);
			edata = extent_try_coalesce_large(tsdn, pac, ehooks,
			    ecache, edata, &coalesced);
		} while (coalesced);
		if (edata_size_get(edata) >=
		    atomic_load_zu(&pac->oversize_threshold, ATOMIC_RELAXED)
		    && !background_thread_enabled()
		    && extent_may_force_decay(pac)) {
			/* Shortcut to purge the oversize extent eagerly. */
			malloc_mutex_unlock(tsdn, &ecache->mtx);
			extent_maximally_purge(tsdn, pac, ehooks, edata);
			return;
		}
	}
label_skip_coalesce:
	extent_deactivate_locked(tsdn, pac, ecache, edata);

	malloc_mutex_unlock(tsdn, &ecache->mtx);
}